

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O0

void printIncDec(_Bool isPost,SStream *O,m680x_info *info,cs_m680x_op *op)

{
  long in_RCX;
  long in_RDX;
  SStream *in_RSI;
  byte in_DIL;
  char *prePostfix;
  char (*local_28) [3];
  
  if ((*(char *)(in_RCX + 0x11) != '\0') &&
     ((((in_DIL & 1) == 0 && ((*(byte *)(in_RCX + 0x12) & 4) == 0)) ||
      (((in_DIL & 1) != 0 && ((*(byte *)(in_RCX + 0x12) & 4) != 0)))))) {
    local_28 = (char (*) [3])(anon_var_dwarf_28cefd + 0x11);
    if (*(int *)(in_RDX + 0x10) == 9) {
      local_28 = (char (*) [3])0x7a8e9b;
      if (*(char *)(in_RCX + 0x11) < '\0') {
        local_28 = (char (*) [3])0x558b18;
      }
    }
    else if ((-3 < *(char *)(in_RCX + 0x11)) && (*(char *)(in_RCX + 0x11) < '\x03')) {
      local_28 = printIncDec::s_inc_dec + (*(char *)(in_RCX + 0x11) + 2);
    }
    SStream_concat(in_RSI,*local_28);
  }
  return;
}

Assistant:

static void printIncDec(bool isPost, SStream *O, m680x_info *info,
	cs_m680x_op *op)
{
	static const char s_inc_dec[][3] = { "--", "-", "", "+", "++" };

	if (!op->idx.inc_dec)
		return;

	if ((!isPost && !(op->idx.flags & M680X_IDX_POST_INC_DEC)) ||
		(isPost && (op->idx.flags & M680X_IDX_POST_INC_DEC))) {
		const char *prePostfix = "";

		if (info->cpu_type == M680X_CPU_TYPE_CPU12)
			prePostfix = (op->idx.inc_dec < 0) ? "-" : "+";
		else if (op->idx.inc_dec >= -2 && (op->idx.inc_dec <= 2)) {
			prePostfix = (char *)s_inc_dec[op->idx.inc_dec + 2];
		}

		SStream_concat(O, prePostfix);
	}
}